

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_std::hash<const_char_*>,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::Identity,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::SetKey,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>,_bool>
* __thiscall
google::
dense_hashtable<char_const*,char_const*,std::hash<char_const*>,google::dense_hash_set<char_const*,std::hash<char_const*>,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>::Identity,google::dense_hash_set<char_const*,std::hash<char_const*>,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>::SetKey,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>
::insert_noresize<char_const*const&,char_const*const&>
          (pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_std::hash<const_char_*>,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::Identity,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::SetKey,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>,_bool>
           *__return_storage_ptr__,
          dense_hashtable<char_const*,char_const*,std::hash<char_const*>,google::dense_hash_set<char_const*,std::hash<char_const*>,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>::Identity,google::dense_hash_set<char_const*,std::hash<char_const*>,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>::SetKey,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>
          *this,char **key,char **args)

{
  long lVar1;
  long lVar2;
  unsigned_long uVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  
  pVar4 = find_position<char_const*>(this,key);
  uVar3 = pVar4.first;
  if (uVar3 == 0xffffffffffffffff) {
    insert_at<char_const*const&>(&__return_storage_ptr__->first,this,pVar4.second,args);
  }
  else {
    lVar1 = *(long *)(this + 0x40);
    lVar2 = *(long *)(this + 0x50);
    (__return_storage_ptr__->first).ht =
         (dense_hashtable<const_char_*,_const_char_*,_std::hash<const_char_*>,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::Identity,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::SetKey,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
          *)this;
    (__return_storage_ptr__->first).pos = (pointer)(lVar2 + uVar3 * 8);
    (__return_storage_ptr__->first).end = (pointer)(lVar2 + lVar1 * 8);
  }
  __return_storage_ptr__->second = uVar3 == 0xffffffffffffffff;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert_noresize(K&& key, Args&&... args) {
    // First, double-check we're not inserting delkey or emptyval
    assert(settings.use_empty() && "Inserting without empty key");
    assert(!equals(std::forward<K>(key), key_info.empty_key) && "Inserting the empty key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) && "Inserting the deleted key");

    const std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first != ILLEGAL_BUCKET) {  // object was already there
      return std::pair<iterator, bool>(
          iterator(this, table + pos.first, table + num_buckets, false),
          false);  // false: we didn't insert
    } else {       // pos.second says where to put it
      return std::pair<iterator, bool>(insert_at(pos.second, std::forward<Args>(args)...), true);
    }
  }